

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall baseObject::~baseObject(baseObject *this)

{
  std::_Vector_base<bezierPoint,_std::allocator<bezierPoint>_>::~_Vector_base
            (&(this->curves).super__Vector_base<bezierPoint,_std::allocator<bezierPoint>_>);
  std::_Vector_base<_point,_std::allocator<_point>_>::~_Vector_base
            (&(this->points).super__Vector_base<_point,_std::allocator<_point>_>);
  return;
}

Assistant:

baseObject::~baseObject()
{
}